

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool,bool>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,bool *args_2,bool *args_3)

{
  string_view name;
  ParameterSymbol *this_00;
  
  this_00 = (ParameterSymbol *)allocate(this,0x178,8);
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::ParameterSymbol::ParameterSymbol(this_00,name,*args_1,*args_2,*args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }